

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyHexToint(sxi32 c)

{
  sxi32 local_c;
  sxi32 c_local;
  
  switch(c) {
  case 0x30:
    local_c = 0;
    break;
  case 0x31:
    local_c = 1;
    break;
  case 0x32:
    local_c = 2;
    break;
  case 0x33:
    local_c = 3;
    break;
  case 0x34:
    local_c = 4;
    break;
  case 0x35:
    local_c = 5;
    break;
  case 0x36:
    local_c = 6;
    break;
  case 0x37:
    local_c = 7;
    break;
  case 0x38:
    local_c = 8;
    break;
  case 0x39:
    local_c = 9;
    break;
  default:
    local_c = -1;
    break;
  case 0x41:
  case 0x61:
    local_c = 10;
    break;
  case 0x42:
  case 0x62:
    local_c = 0xb;
    break;
  case 0x43:
  case 99:
    local_c = 0xc;
    break;
  case 0x44:
  case 100:
    local_c = 0xd;
    break;
  case 0x45:
  case 0x65:
    local_c = 0xe;
    break;
  case 0x46:
  case 0x66:
    local_c = 0xf;
  }
  return local_c;
}

Assistant:

JX9_PRIVATE sxi32 SyHexToint(sxi32 c)
{
	switch(c){
	case '0': return 0;
	case '1': return 1;
	case '2': return 2;
	case '3': return 3;
	case '4': return 4;
	case '5': return 5;
	case '6': return 6;
	case '7': return 7;
	case '8': return 8;
	case '9': return 9;
	case 'A': case 'a': return 10;
	case 'B': case 'b': return 11;
	case 'C': case 'c': return 12;
	case 'D': case 'd': return 13;
	case 'E': case 'e': return 14;
	case 'F': case 'f': return 15;
	}
	return -1; 	
}